

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CConstructSymbolTableVisitor.cpp
# Opt level: O2

void __thiscall CConstructSymbolTableVisitor::Visit(CConstructSymbolTableVisitor *this,CField *stm)

{
  CType *pCVar1;
  CIdExp *pCVar2;
  element_type *peVar3;
  VariableInfo *this_00;
  __shared_ptr<VariableInfo,_(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_ptr<TypeInfo,_(__gnu_cxx::_Lock_policy)2> local_38;
  
  local_48._M_ptr = (element_type *)0x0;
  local_48._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_ptr<TypeInfo,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(((this->info).super___shared_ptr<FullInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->iType
              ).super___shared_ptr<TypeInfo,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<TypeInfo,_(__gnu_cxx::_Lock_policy)2> *)&local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
  pCVar1 = (stm->type)._M_t.super___uniq_ptr_impl<CType,_std::default_delete<CType>_>._M_t.
           super__Tuple_impl<0UL,_CType_*,_std::default_delete<CType>_>.
           super__Head_base<0UL,_CType_*,_false>._M_head_impl;
  if (pCVar1 != (CType *)0x0) {
    (*(code *)**(undefined8 **)&(pCVar1->super_IWrapper).super_PositionedNode)(pCVar1,this);
  }
  std::__cxx11::string::assign
            ((char *)&((this->info).super___shared_ptr<FullInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                      ->iName);
  pCVar2 = (stm->id)._M_t.super___uniq_ptr_impl<CIdExp,_std::default_delete<CIdExp>_>._M_t.
           super__Tuple_impl<0UL,_CIdExp_*,_std::default_delete<CIdExp>_>.
           super__Head_base<0UL,_CIdExp_*,_false>._M_head_impl;
  if (pCVar2 != (CIdExp *)0x0) {
    (*(code *)**(undefined8 **)&(pCVar2->super_IExpression).super_PositionedNode)(pCVar2,this);
  }
  this_00 = (VariableInfo *)operator_new(0x38);
  peVar3 = (this->info).super___shared_ptr<FullInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_ptr<TypeInfo,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_38,&(peVar3->iType).super___shared_ptr<TypeInfo,_(__gnu_cxx::_Lock_policy)2>);
  VariableInfo::VariableInfo(this_00,&peVar3->iName,(shared_ptr<TypeInfo> *)&local_38);
  std::__shared_ptr<VariableInfo,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<VariableInfo,void>
            ((__shared_ptr<VariableInfo,(__gnu_cxx::_Lock_policy)2> *)&local_48,this_00);
  std::__shared_ptr<VariableInfo,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(((this->info).super___shared_ptr<FullInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              iVariable).super___shared_ptr<VariableInfo,_(__gnu_cxx::_Lock_policy)2>,&local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
  return;
}

Assistant:

void CConstructSymbolTableVisitor::Visit( CField &stm )
{
//	std::cout << "field\n";
	info->iType = nullptr;
	if( stm.type ) {
		stm.type->Accept( *this );
	}
	info->iName = "";
	if( stm.id ) {
		stm.id->Accept( *this );
	}
	info->iVariable = std::shared_ptr<VariableInfo>( new VariableInfo( info->iName, info->iType ) );
}